

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall CLI::App::_parse_single_config(App *this,ConfigItem *item,size_t level)

{
  bool bVar1;
  config_extras_mode cVar2;
  undefined1 uVar3;
  MultiOptionPolicy MVar4;
  __type_conflict _Var5;
  int iVar6;
  int iVar7;
  ConfigItem *pCVar8;
  App *level_00;
  Option *pOVar9;
  size_type sVar10;
  undefined8 uVar11;
  size_type sVar12;
  element_type *peVar13;
  int64_t iVar14;
  int *piVar15;
  ConfigItem *in_RDX;
  App *in_RSI;
  App *in_RDI;
  App *in_stack_000000a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *valid_res;
  iterator __end6;
  iterator __begin6;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range6;
  bool valid_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *res_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  int64_t val;
  bool converted;
  string res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  Option *testop_2;
  Option *testop_1;
  Option *testop;
  Option *op;
  App *subcom;
  string *in_stack_fffffffffffffb68;
  App *in_stack_fffffffffffffb70;
  Classifier *in_stack_fffffffffffffb78;
  App *in_stack_fffffffffffffb80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb88;
  Option *in_stack_fffffffffffffb90;
  size_t in_stack_fffffffffffffb98;
  App *in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb8;
  int in_stack_fffffffffffffbbc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  App *in_stack_fffffffffffffbd0;
  ConfigItem *in_stack_fffffffffffffbd8;
  undefined2 uVar16;
  App *in_stack_fffffffffffffbe0;
  string *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  Option *in_stack_fffffffffffffc10;
  bool local_3c1;
  string *in_stack_fffffffffffffc58;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_338;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_330;
  byte local_321;
  reference local_320;
  string *in_stack_fffffffffffffce8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffcf0;
  Option *in_stack_fffffffffffffcf8;
  allocator<char> local_249 [97];
  long local_1e8;
  byte local_1d9;
  undefined1 local_1d8 [39];
  undefined1 local_1b1;
  undefined4 local_18c;
  reference local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  undefined4 local_134;
  Option *local_110;
  Option *local_e8;
  Option *local_c0;
  Option *local_58;
  ConfigItem *item_00;
  bool local_1;
  
  item_00 = in_RDX;
  pCVar8 = (ConfigItem *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_RSI);
  if (in_RDX < pCVar8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffb70,(size_type)in_stack_fffffffffffffb68);
    ::std::__cxx11::string::string
              (in_stack_fffffffffffffbb0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    level_00 = get_subcommand_no_throw(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb70);
    if (level_00 == (App *)0x0) {
      local_3c1 = false;
    }
    else {
      local_3c1 = _parse_single_config(in_RSI,item_00,(size_t)level_00);
    }
    local_1 = local_3c1;
  }
  else {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
    iVar7 = (int)((ulong)in_RDX >> 0x20);
    if (bVar1) {
      if ((in_RDI->configurable_ & 1U) != 0) {
        increment_parsed(in_stack_fffffffffffffb80);
        _trigger_pre_parse(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        if (in_RDI->parent_ != (App *)0x0) {
          std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::push_back
                    ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)in_stack_fffffffffffffb70,
                     (value_type *)in_stack_fffffffffffffb68);
        }
      }
      local_1 = true;
    }
    else {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
      if (bVar1) {
        if ((in_RDI->configurable_ & 1U) != 0) {
          bVar1 = ::std::function::operator_cast_to_bool((function<void_()> *)0x1dfa2e);
          uVar16 = (undefined2)((ulong)in_stack_fffffffffffffbd8 >> 0x30);
          if (bVar1) {
            _process_callbacks(in_stack_fffffffffffffbd0);
            _process_requirements(in_stack_000000a0);
            run_callback(in_stack_fffffffffffffbe0,SUB21((ushort)uVar16 >> 8,0),SUB21(uVar16,0));
          }
        }
        local_1 = true;
      }
      else {
        ::std::operator+((char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                         in_stack_fffffffffffffbb0);
        pOVar9 = get_option_no_throw((App *)CONCAT17(in_stack_fffffffffffffbff,
                                                     in_stack_fffffffffffffbf8),
                                     in_stack_fffffffffffffbf0);
        ::std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb70);
        local_58 = pOVar9;
        if (pOVar9 == (Option *)0x0) {
          sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &(in_RSI->name_).field_2);
          if (sVar10 == 1) {
            ::std::operator+((char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                             in_stack_fffffffffffffbb0);
            local_58 = get_option_no_throw((App *)CONCAT17(in_stack_fffffffffffffbff,
                                                           in_stack_fffffffffffffbf8),
                                           in_stack_fffffffffffffbf0);
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb70);
          }
          if (local_58 == (Option *)0x0) {
            ::std::__cxx11::string::string
                      (in_stack_fffffffffffffbb0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
            local_58 = get_option_no_throw((App *)CONCAT17(in_stack_fffffffffffffbff,
                                                           in_stack_fffffffffffffbf8),
                                           in_stack_fffffffffffffbf0);
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb70);
          }
          else {
            bVar1 = OptionBase<CLI::Option>::get_configurable
                              (&local_58->super_OptionBase<CLI::Option>);
            if (!bVar1) {
              ::std::__cxx11::string::string
                        (in_stack_fffffffffffffbb0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
              pOVar9 = get_option_no_throw((App *)CONCAT17(in_stack_fffffffffffffbff,
                                                           in_stack_fffffffffffffbf8),
                                           in_stack_fffffffffffffbf0);
              ::std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb70);
              local_c0 = pOVar9;
              if ((pOVar9 != (Option *)0x0) &&
                 (bVar1 = OptionBase<CLI::Option>::get_configurable
                                    (&pOVar9->super_OptionBase<CLI::Option>), bVar1)) {
                local_58 = local_c0;
              }
            }
          }
        }
        else {
          bVar1 = OptionBase<CLI::Option>::get_configurable(&pOVar9->super_OptionBase<CLI::Option>);
          if (!bVar1) {
            sVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &(in_RSI->name_).field_2);
            if (sVar10 == 1) {
              ::std::operator+((char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8)
                               ,in_stack_fffffffffffffbb0);
              pOVar9 = get_option_no_throw((App *)CONCAT17(in_stack_fffffffffffffbff,
                                                           in_stack_fffffffffffffbf8),
                                           in_stack_fffffffffffffbf0);
              ::std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb70);
              local_e8 = pOVar9;
              if ((pOVar9 != (Option *)0x0) &&
                 (bVar1 = OptionBase<CLI::Option>::get_configurable
                                    (&pOVar9->super_OptionBase<CLI::Option>), bVar1)) {
                local_58 = local_e8;
              }
            }
            bVar1 = OptionBase<CLI::Option>::get_configurable
                              (&local_58->super_OptionBase<CLI::Option>);
            if (!bVar1) {
              ::std::__cxx11::string::string
                        (in_stack_fffffffffffffbb0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
              pOVar9 = get_option_no_throw((App *)CONCAT17(in_stack_fffffffffffffbff,
                                                           in_stack_fffffffffffffbf8),
                                           in_stack_fffffffffffffbf0);
              ::std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb70);
              local_110 = pOVar9;
              if ((pOVar9 != (Option *)0x0) &&
                 (bVar1 = OptionBase<CLI::Option>::get_configurable
                                    (&pOVar9->super_OptionBase<CLI::Option>), bVar1)) {
                local_58 = local_110;
              }
            }
          }
        }
        if (local_58 == (Option *)0x0) {
          cVar2 = get_allow_config_extras(in_RDI);
          if (cVar2 == capture) {
            local_134 = 0;
            ConfigItem::fullname_abi_cxx11_(in_stack_fffffffffffffbd8);
            ::std::
            vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
            ::emplace_back<CLI::detail::Classifier,std::__cxx11::string>
                      ((vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb70);
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb70);
            local_170 = &(in_RSI->description_).field_2;
            local_178._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffb68);
            local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffffb68);
            while (bVar1 = __gnu_cxx::
                           operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)in_stack_fffffffffffffb70,
                                      (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)in_stack_fffffffffffffb68), ((bVar1 ^ 0xffU) & 1) != 0) {
              local_188 = __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_178);
              local_18c = 0;
              ::std::
              vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
              ::emplace_back<CLI::detail::Classifier,std::__cxx11::string_const&>
                        ((vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb70);
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_178);
            }
          }
          local_1 = false;
        }
        else {
          bVar1 = OptionBase<CLI::Option>::get_configurable
                            (&local_58->super_OptionBase<CLI::Option>);
          if (bVar1) {
            bVar1 = Option::empty((Option *)0x1dfff4);
            if (bVar1) {
              iVar6 = Option::get_expected_min(local_58);
              if (iVar6 == 0) {
                sVar12 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&(in_RSI->description_).field_2);
                if (sVar12 < 2) {
                  peVar13 = std::
                            __shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x1e0042);
                  (*peVar13->_vptr_Config[2])(local_1d8,peVar13,in_RSI);
                  local_1d9 = 0;
                  uVar3 = OptionBase<CLI::Option>::get_disable_flag_override
                                    (&local_58->super_OptionBase<CLI::Option>);
                  if ((bool)uVar3) {
                    ::std::__cxx11::string::string
                              (in_stack_fffffffffffffbb0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
                    iVar14 = CLI::detail::to_flag_value
                                       ((string *)CONCAT17(uVar3,in_stack_fffffffffffffbf8));
                    ::std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffb70);
                    local_1e8 = iVar14;
                    if (iVar14 == 1) {
                      ::std::allocator<char>::allocator();
                      ::std::__cxx11::string::string<std::allocator<char>>
                                (in_stack_fffffffffffffbb0,
                                 (char *)CONCAT44(in_stack_fffffffffffffbac,
                                                  in_stack_fffffffffffffba8),
                                 (allocator<char> *)in_stack_fffffffffffffba0);
                      Option::get_flag_value
                                (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0._M_current,
                                 in_stack_fffffffffffffce8);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                                (in_stack_fffffffffffffbc0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
                      ::std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffb70);
                      ::std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffb70);
                      ::std::allocator<char>::~allocator(local_249);
                      local_1d9 = 1;
                    }
                  }
                  if ((local_1d9 & 1) == 0) {
                    piVar15 = __errno_location();
                    *piVar15 = 0;
                    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)in_stack_fffffffffffffb70,
                                              (char *)in_stack_fffffffffffffb68);
                    if ((((bVar1 ^ 0xffU) & 1) != 0) ||
                       (iVar7 = Option::get_expected_max(local_58), iVar7 < 2)) {
                      ::std::__cxx11::string::string
                                (in_stack_fffffffffffffbb0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
                      Option::get_flag_value
                                (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0._M_current,
                                 in_stack_fffffffffffffce8);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                                (in_stack_fffffffffffffbc0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
                      ::std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffb70);
                      ::std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffb70);
                    }
                  }
                  ::std::__cxx11::string::string
                            (in_stack_fffffffffffffbb0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
                  Option::add_result((Option *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
                  ::std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffb70);
                  ::std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffb70);
                  return true;
                }
                sVar12 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&(in_RSI->description_).field_2);
                in_stack_fffffffffffffbbc = (int)sVar12;
                iVar6 = Option::get_items_expected_max((Option *)in_stack_fffffffffffffb70);
                if ((iVar6 < in_stack_fffffffffffffbbc) &&
                   (MVar4 = OptionBase<CLI::Option>::get_multi_option_policy
                                      (&local_58->super_OptionBase<CLI::Option>), MVar4 != TakeAll))
                {
                  iVar6 = Option::get_items_expected_max((Option *)in_stack_fffffffffffffb70);
                  if (1 < iVar6) {
                    uVar11 = __cxa_allocate_exception(0x38);
                    ConfigItem::fullname_abi_cxx11_(in_stack_fffffffffffffbd8);
                    Option::get_items_expected_max((Option *)in_stack_fffffffffffffb70);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&(in_RSI->description_).field_2);
                    ArgumentMismatch::AtMost(in_stack_fffffffffffffc58,iVar7,(size_t)in_RDI);
                    __cxa_throw(uVar11,&ArgumentMismatch::typeinfo,
                                ArgumentMismatch::~ArgumentMismatch);
                  }
                  bVar1 = OptionBase<CLI::Option>::get_disable_flag_override
                                    (&local_58->super_OptionBase<CLI::Option>);
                  if (!bVar1) {
                    uVar11 = __cxa_allocate_exception(0x38);
                    ConfigItem::fullname_abi_cxx11_(in_stack_fffffffffffffbd8);
                    ConversionError::TooManyInputsFlag
                              ((string *)
                               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
                    __cxa_throw(uVar11,&ConversionError::typeinfo,ConversionError::~ConversionError)
                    ;
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffb68);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffb68);
                  do {
                    bVar1 = __gnu_cxx::
                            operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)in_stack_fffffffffffffb70,
                                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)in_stack_fffffffffffffb68);
                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                      return true;
                    }
                    local_320 = __gnu_cxx::
                                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&stack0xfffffffffffffcf0);
                    local_321 = 0;
                    bVar1 = std::
                            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::empty((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)in_stack_fffffffffffffb80);
                    if (bVar1) {
                      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)in_stack_fffffffffffffb70,
                                                (char *)in_stack_fffffffffffffb68);
                      if ((((bVar1) ||
                           (bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffb70,
                                                  (char *)in_stack_fffffffffffffb68), bVar1)) ||
                          (bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffb70,
                                                  (char *)in_stack_fffffffffffffb68), bVar1)) ||
                         (bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffb70,
                                                  (char *)in_stack_fffffffffffffb68), bVar1)) {
                        local_321 = 1;
                      }
                    }
                    else {
                      local_330 = &local_58->default_flag_values_;
                      local_338._M_current =
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)std::
                              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)in_stack_fffffffffffffb68);
                      std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffb68);
                      while (bVar1 = __gnu_cxx::
                                     operator==<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                               ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                 *)in_stack_fffffffffffffb70,
                                                (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                 *)in_stack_fffffffffffffb68),
                            ((bVar1 ^ 0xffU) & 1) != 0) {
                        __gnu_cxx::
                        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ::operator*(&local_338);
                        _Var5 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffb90,
                                                  in_stack_fffffffffffffb88);
                        if (_Var5) {
                          local_321 = 1;
                          break;
                        }
                        __gnu_cxx::
                        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ::operator++(&local_338);
                      }
                    }
                    if ((local_321 & 1) == 0) {
                      uVar11 = __cxa_allocate_exception(0x38);
                      ::std::allocator<char>::allocator();
                      ::std::__cxx11::string::string<std::allocator<char>>
                                (in_stack_fffffffffffffbb0,
                                 (char *)CONCAT44(in_stack_fffffffffffffbac,
                                                  in_stack_fffffffffffffba8),
                                 (allocator<char> *)in_stack_fffffffffffffba0);
                      InvalidError::InvalidError
                                ((InvalidError *)in_stack_fffffffffffffbb0,
                                 (string *)
                                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
                      __cxa_throw(uVar11,&InvalidError::typeinfo,InvalidError::~InvalidError);
                    }
                    in_stack_fffffffffffffb90 = local_58;
                    ::std::__cxx11::string::string
                              (in_stack_fffffffffffffbb0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
                    Option::add_result((Option *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68
                                      );
                    ::std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffb70);
                    __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&stack0xfffffffffffffcf0);
                  } while( true );
                }
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffbc0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
              Option::add_result(in_stack_fffffffffffffb90,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)in_stack_fffffffffffffb88);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffb80);
              Option::run_callback(in_stack_fffffffffffffc10);
            }
            local_1 = true;
          }
          else {
            cVar2 = get_allow_config_extras(in_RDI);
            if (cVar2 != ignore_all) {
              local_1b1 = 1;
              uVar11 = __cxa_allocate_exception(0x38);
              ConfigItem::fullname_abi_cxx11_(in_stack_fffffffffffffbd8);
              ConfigError::NotConfigurable
                        ((string *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
              local_1b1 = 0;
              __cxa_throw(uVar11,&ConfigError::typeinfo,ConfigError::~ConfigError);
            }
            local_1 = false;
          }
        }
      }
    }
  }
  return local_1;
}

Assistant:

CLI11_INLINE bool App::_parse_single_config(const ConfigItem &item, std::size_t level) {

    if(level < item.parents.size()) {
        auto *subcom = get_subcommand_no_throw(item.parents.at(level));
        return (subcom != nullptr) ? subcom->_parse_single_config(item, level + 1) : false;
    }
    // check for section open
    if(item.name == "++") {
        if(configurable_) {
            increment_parsed();
            _trigger_pre_parse(2);
            if(parent_ != nullptr) {
                parent_->parsed_subcommands_.push_back(this);
            }
        }
        return true;
    }
    // check for section close
    if(item.name == "--") {
        if(configurable_ && parse_complete_callback_) {
            _process_callbacks();
            _process_requirements();
            run_callback();
        }
        return true;
    }
    Option *op = get_option_no_throw("--" + item.name);
    if(op == nullptr) {
        if(item.name.size() == 1) {
            op = get_option_no_throw("-" + item.name);
        }
        if(op == nullptr) {
            op = get_option_no_throw(item.name);
        } else if(!op->get_configurable()) {
            auto *testop = get_option_no_throw(item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
    } else if(!op->get_configurable()) {
        if(item.name.size() == 1) {
            auto *testop = get_option_no_throw("-" + item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
        if(!op->get_configurable()) {
            auto *testop = get_option_no_throw(item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
    }

    if(op == nullptr) {
        // If the option was not present
        if(get_allow_config_extras() == config_extras_mode::capture) {
            // Should we worry about classifying the extras properly?
            missing_.emplace_back(detail::Classifier::NONE, item.fullname());
            for(const auto &input : item.inputs) {
                missing_.emplace_back(detail::Classifier::NONE, input);
            }
        }
        return false;
    }

    if(!op->get_configurable()) {
        if(get_allow_config_extras() == config_extras_mode::ignore_all) {
            return false;
        }
        throw ConfigError::NotConfigurable(item.fullname());
    }

    if(op->empty()) {

        if(op->get_expected_min() == 0) {
            if(item.inputs.size() <= 1) {
                // Flag parsing
                auto res = config_formatter_->to_flag(item);
                bool converted{false};
                if(op->get_disable_flag_override()) {
                    auto val = detail::to_flag_value(res);
                    if(val == 1) {
                        res = op->get_flag_value(item.name, "{}");
                        converted = true;
                    }
                }

                if(!converted) {
                    errno = 0;
                    if(res != "{}" || op->get_expected_max() <= 1) {
                        res = op->get_flag_value(item.name, res);
                    }
                }

                op->add_result(res);
                return true;
            }
            if(static_cast<int>(item.inputs.size()) > op->get_items_expected_max() &&
               op->get_multi_option_policy() != MultiOptionPolicy::TakeAll) {
                if(op->get_items_expected_max() > 1) {
                    throw ArgumentMismatch::AtMost(item.fullname(), op->get_items_expected_max(), item.inputs.size());
                }

                if(!op->get_disable_flag_override()) {
                    throw ConversionError::TooManyInputsFlag(item.fullname());
                }
                // if the disable flag override is set then we must have the flag values match a known flag value
                // this is true regardless of the output value, so an array input is possible and must be accounted for
                for(const auto &res : item.inputs) {
                    bool valid_value{false};
                    if(op->default_flag_values_.empty()) {
                        if(res == "true" || res == "false" || res == "1" || res == "0") {
                            valid_value = true;
                        }
                    } else {
                        for(const auto &valid_res : op->default_flag_values_) {
                            if(valid_res.second == res) {
                                valid_value = true;
                                break;
                            }
                        }
                    }

                    if(valid_value) {
                        op->add_result(res);
                    } else {
                        throw InvalidError("invalid flag argument given");
                    }
                }
                return true;
            }
        }
        op->add_result(item.inputs);
        op->run_callback();
    }

    return true;
}